

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::buildFullText(XMLUri *this)

{
  XMLCh *src;
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  XMLCh *target;
  XMLCh tmpBuf [17];
  XMLCh *pXVar8;
  
  XVar2 = XMLString::stringLen(this->fScheme);
  XVar3 = XMLString::stringLen(this->fFragment);
  pXVar8 = this->fHost;
  if (pXVar8 == (XMLCh *)0x0) {
    pXVar8 = this->fRegAuth;
  }
  XVar4 = XMLString::stringLen(pXVar8);
  XVar5 = XMLString::stringLen(this->fPath);
  XVar6 = XMLString::stringLen(this->fQueryString);
  XVar7 = XMLString::stringLen(this->fUserInfo);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURIText);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(XVar2 + XVar3 + XVar5 + XVar6 + XVar7 + XVar4) * 2 + 0x4c
                    );
  pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar1);
  this->fURIText = pXVar8;
  *pXVar8 = L'\0';
  if (this->fScheme != (XMLCh *)0x0) {
    XMLString::catString(pXVar8,this->fScheme);
    XVar2 = XMLString::stringLen(this->fURIText);
    pXVar8[XVar2] = L':';
    pXVar8 = pXVar8 + XVar2 + 1;
  }
  pXVar9 = this->fHost;
  src = this->fRegAuth;
  if (pXVar9 != (XMLCh *)0x0 || src != (XMLCh *)0x0) {
    target = pXVar8 + 2;
    pXVar8[0] = L'/';
    pXVar8[1] = L'/';
    if (pXVar9 == (XMLCh *)0x0) {
      XMLString::copyString(target,src);
      XVar2 = XMLString::stringLen(this->fRegAuth);
      pXVar8 = target + XVar2;
    }
    else {
      if (this->fUserInfo != (XMLCh *)0x0) {
        XMLString::copyString(target,this->fUserInfo);
        XVar2 = XMLString::stringLen(this->fUserInfo);
        pXVar8 = target + XVar2;
        target = pXVar8 + 1;
        *pXVar8 = L'@';
        pXVar9 = this->fHost;
      }
      XMLString::copyString(target,pXVar9);
      XVar2 = XMLString::stringLen(this->fHost);
      pXVar8 = target + XVar2;
      iVar1 = this->fPort;
      if (iVar1 != -1) {
        *pXVar8 = L':';
        XMLString::binToText(iVar1,tmpBuf,0x10,10,this->fMemoryManager);
        XMLString::copyString(pXVar8 + 1,tmpBuf);
        XVar2 = XMLString::stringLen(tmpBuf);
        pXVar8 = pXVar8 + XVar2 + 1;
      }
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(pXVar8,this->fPath);
    XVar2 = XMLString::stringLen(this->fPath);
    pXVar8 = pXVar8 + XVar2;
  }
  pXVar9 = this->fQueryString;
  if (pXVar9 != (XMLCh *)0x0) {
    *pXVar8 = L'?';
    XMLString::copyString(pXVar8 + 1,pXVar9);
    XVar2 = XMLString::stringLen(this->fQueryString);
    pXVar8 = pXVar8 + XVar2 + 1;
  }
  pXVar9 = this->fFragment;
  if (pXVar9 != (XMLCh *)0x0) {
    *pXVar8 = L'#';
    XMLString::copyString(pXVar8 + 1,pXVar9);
    XVar2 = XMLString::stringLen(this->fFragment);
    pXVar8 = pXVar8 + XVar2 + 1;
  }
  *pXVar8 = L'\0';
  return;
}

Assistant:

void XMLUri::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = XMLString::stringLen(fScheme) + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost ? fHost : fRegAuth) + 2
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQueryString) + 1
                           + XMLString::stringLen(fUserInfo) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURIText);//delete [] fURIText;
    fURIText = (XMLCh*) fMemoryManager->allocate(bufSize * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURIText = 0;

    XMLCh* outPtr = fURIText;
    if (fScheme != 0)
    {
        XMLString::catString(fURIText, getScheme());
        outPtr += XMLString::stringLen(fURIText);
        *outPtr++ = chColon;
    }

    // Authority
    if (fHost || fRegAuth)
    {
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;

        // Server based authority.
        if (fHost)
        {
            if (fUserInfo)
            {
                XMLString::copyString(outPtr, fUserInfo);
                outPtr += XMLString::stringLen(fUserInfo);
                *outPtr++ = chAt;
            }

            XMLString::copyString(outPtr, fHost);
            outPtr += XMLString::stringLen(fHost);

            //
            //  If the port is -1, then we don't put it in. Else we need
            //  to because it was explicitly provided.
            //
            if (fPort != -1)
            {
                *outPtr++ = chColon;

                XMLCh tmpBuf[17];
                XMLString::binToText(fPort, tmpBuf, 16, 10, fMemoryManager);
                XMLString::copyString(outPtr, tmpBuf);
                outPtr += XMLString::stringLen(tmpBuf);
            }
        }
        // Registry based authority.
        else {
            XMLString::copyString(outPtr, fRegAuth);
            outPtr += XMLString::stringLen(fRegAuth);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQueryString)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQueryString);
        outPtr += XMLString::stringLen(fQueryString);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}